

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O1

bool __thiscall duckdb::ListColumnData::IsPersistent(ListColumnData *this)

{
  int iVar1;
  ColumnSegment *segment;
  __pointer_type pCVar2;
  pointer pCVar3;
  
  for (pCVar2 = SegmentTree<duckdb::ColumnSegment,_false>::GetRootSegment
                          (&(this->super_ColumnData).data.
                            super_SegmentTree<duckdb::ColumnSegment,_false>);
      (pCVar2 != (ColumnSegment *)0x0 && (pCVar2->segment_type == PERSISTENT));
      pCVar2 = (pCVar2->super_SegmentBase<duckdb::ColumnSegment>).next._M_b._M_p) {
  }
  if (pCVar2 == (ColumnSegment *)0x0) {
    for (pCVar2 = SegmentTree<duckdb::ColumnSegment,_false>::GetRootSegment
                            (&(this->validity).super_ColumnData.data.
                              super_SegmentTree<duckdb::ColumnSegment,_false>);
        (pCVar2 != (ColumnSegment *)0x0 && (pCVar2->segment_type == PERSISTENT));
        pCVar2 = (pCVar2->super_SegmentBase<duckdb::ColumnSegment>).next._M_b._M_p) {
    }
    if (pCVar2 == (ColumnSegment *)0x0) {
      pCVar3 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
               operator->(&this->child_column);
      iVar1 = (*pCVar3->_vptr_ColumnData[0x1e])(pCVar3);
      return SUB41(iVar1,0);
    }
  }
  return false;
}

Assistant:

bool ListColumnData::IsPersistent() {
	return ColumnData::IsPersistent() && validity.IsPersistent() && child_column->IsPersistent();
}